

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exor.c
# Opt level: O0

int GetQCost(int nVars,int nNegs)

{
  int local_24;
  int Extra;
  int nNegs_local;
  int nVars_local;
  
  if (nVars < nNegs) {
    __assert_fail("nVars >= nNegs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/exor/exor.c"
                  ,99,"int GetQCost(int, int)");
  }
  if (nVars == 0) {
    return 1;
  }
  if (nVars == 1) {
    if (nNegs == 0) {
      return 1;
    }
    if (nNegs == 1) {
      return 2;
    }
  }
  if (nVars == 2) {
    if (nNegs < 2) {
      return 5;
    }
    if (nNegs == 2) {
      return 6;
    }
  }
  if (nVars == 3) {
    if (nNegs < 2) {
      return 0xe;
    }
    if (nNegs == 2) {
      return 0x10;
    }
    if (nNegs == 3) {
      return 0x12;
    }
  }
  local_24 = nNegs - nVars / 2;
  if (local_24 < 1) {
    local_24 = 0;
  }
  else {
    local_24 = local_24 * 2;
  }
  return (nVars + -4) * 0xc + 0x14 + local_24;
}

Assistant:

int GetQCost( int nVars, int nNegs )
{
    int Extra;
    assert( nVars >= nNegs );
    if ( nVars == 0 )  
        return 1;
    if ( nVars == 1 )  
    {
        if ( nNegs == 0 )  return 1;
        if ( nNegs == 1 )  return 2;
    }
    if ( nVars == 2 )
    {
        if ( nNegs <= 1 )  return 5;
        if ( nNegs == 2 )  return 6;
    }
    if ( nVars == 3 )
    {
        if ( nNegs <= 1 )  return 14;
        if ( nNegs == 2 )  return 16;
        if ( nNegs == 3 )  return 18;
    }
    Extra = nNegs - nVars/2;
    return 20 + 12 * (nVars - 4) + (Extra > 0 ? 2 * Extra : 0);

}